

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::follow_link(Fl_Help_View *this,Fl_Help_Link *linkp)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *tempptr;
  char temp [2048];
  char dir [2048];
  char target [32];
  Fl_Help_Link *linkp_local;
  Fl_Help_View *this_local;
  
  clear_selection(this);
  fl_strlcpy(dir + 0x7f8,linkp->name,0x20);
  Fl_Widget::set_changed((Fl_Widget *)this);
  iVar1 = strcmp(linkp->filename,this->filename_);
  if ((iVar1 == 0) || (linkp->filename[0] == '\0')) {
    if (dir[0x7f8] == '\0') {
      topline(this,0);
    }
    else {
      topline(this,dir + 0x7f8);
    }
  }
  else {
    pcVar2 = strchr(this->directory_,0x3a);
    if ((pcVar2 == (char *)0x0) || (pcVar2 = strchr(linkp->filename,0x3a), pcVar2 != (char *)0x0)) {
      if ((linkp->filename[0] == '/') ||
         (pcVar2 = strchr(linkp->filename,0x3a), pcVar2 != (char *)0x0)) {
        fl_strlcpy((char *)&tempptr,linkp->filename,0x800);
      }
      else if (this->directory_[0] == '\0') {
        fl_getcwd(temp + 0x7f8,0x800);
        snprintf((char *)&tempptr,0x800,"file:%s/%s",temp + 0x7f8,linkp);
      }
      else {
        snprintf((char *)&tempptr,0x800,"%s/%s",this->directory_,linkp);
      }
    }
    else if (linkp->filename[0] == '/') {
      fl_strlcpy((char *)&tempptr,this->directory_,0x800);
      pcVar2 = strchr(this->directory_,0x3a);
      pcVar2 = strrchr(pcVar2 + 3,0x2f);
      if (pcVar2 == (char *)0x0) {
        fl_strlcat((char *)&tempptr,linkp->filename,0x800);
      }
      else {
        fl_strlcpy(pcVar2,linkp->filename,0x800);
      }
    }
    else {
      snprintf((char *)&tempptr,0x800,"%s/%s",this->directory_,linkp);
    }
    if (linkp->name[0] != '\0') {
      sVar3 = strlen((char *)&tempptr);
      sVar4 = strlen((char *)&tempptr);
      snprintf(temp + (sVar3 - 8),0x800 - sVar4,"#%s",linkp->name);
    }
    load(this,(char *)&tempptr);
  }
  leftline(this,0);
  return;
}

Assistant:

void Fl_Help_View::follow_link(Fl_Help_Link *linkp)
{
  char		target[32];	// Current target

  clear_selection();

  strlcpy(target, linkp->name, sizeof(target));

  set_changed();

  if (strcmp(linkp->filename, filename_) != 0 && linkp->filename[0])
  {
    char	dir[FL_PATH_MAX];	// Current directory
    char	temp[FL_PATH_MAX],	// Temporary filename
	      *tempptr;	// Pointer into temporary filename


    if (strchr(directory_, ':') != NULL &&
        strchr(linkp->filename, ':') == NULL)
    {
      if (linkp->filename[0] == '/')
      {
        strlcpy(temp, directory_, sizeof(temp));
        if ((tempptr = strrchr(strchr(directory_, ':') + 3, '/')) != NULL)
	  strlcpy(tempptr, linkp->filename, sizeof(temp));
	else
	  strlcat(temp, linkp->filename, sizeof(temp));
      }
      else
	snprintf(temp, sizeof(temp), "%s/%s", directory_, linkp->filename);
    }
    else if (linkp->filename[0] != '/' && strchr(linkp->filename, ':') == NULL)
    {
      if (directory_[0])
	snprintf(temp, sizeof(temp), "%s/%s", directory_, linkp->filename);
      else
      {
	  fl_getcwd(dir, sizeof(dir));
	snprintf(temp, sizeof(temp), "file:%s/%s", dir, linkp->filename);
      }
    }
    else
      strlcpy(temp, linkp->filename, sizeof(temp));

    if (linkp->name[0])
      snprintf(temp + strlen(temp), sizeof(temp) - strlen(temp), "#%s",
	       linkp->name);

    load(temp);
  }
  else if (target[0])
    topline(target);
  else
    topline(0);

  leftline(0);
}